

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.h
# Opt level: O1

void __thiscall duckdb::RegexpExtractBindData::RegexpExtractBindData(RegexpExtractBindData *this)

{
  (this->super_RegexpBaseBindData).options.max_mem_ = 0x800000;
  (this->super_RegexpBaseBindData).options.encoding_ = EncodingUTF8;
  (this->super_RegexpBaseBindData).options.posix_syntax_ = false;
  (this->super_RegexpBaseBindData).options.longest_match_ = false;
  (this->super_RegexpBaseBindData).options.log_errors_ = true;
  (this->super_RegexpBaseBindData).options.literal_ = false;
  (this->super_RegexpBaseBindData).options.never_nl_ = false;
  (this->super_RegexpBaseBindData).options.dot_nl_ = false;
  (this->super_RegexpBaseBindData).options.never_capture_ = false;
  (this->super_RegexpBaseBindData).options.case_sensitive_ = true;
  (this->super_RegexpBaseBindData).options.perl_classes_ = false;
  (this->super_RegexpBaseBindData).options.word_boundary_ = false;
  (this->super_RegexpBaseBindData).options.one_line_ = false;
  (this->super_RegexpBaseBindData).constant_string._M_dataplus._M_p =
       (pointer)&(this->super_RegexpBaseBindData).constant_string.field_2;
  (this->super_RegexpBaseBindData).constant_string._M_string_length = 0;
  (this->super_RegexpBaseBindData).constant_string.field_2._M_local_buf[0] = '\0';
  (this->super_RegexpBaseBindData).constant_pattern = false;
  (this->super_RegexpBaseBindData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__RegexpExtractBindData_02487af8;
  (this->group_string)._M_dataplus._M_p = (pointer)&(this->group_string).field_2;
  (this->group_string)._M_string_length = 0;
  (this->group_string).field_2._M_local_buf[0] = '\0';
  (this->rewrite).data_ = (const_pointer)0x0;
  (this->rewrite).size_ = 0;
  return;
}

Assistant:

Options() :
      max_mem_(kDefaultMaxMem),
      encoding_(EncodingUTF8),
      posix_syntax_(false),
      longest_match_(false),
      log_errors_(true),
      literal_(false),
      never_nl_(false),
      dot_nl_(false),
      never_capture_(false),
      case_sensitive_(true),
      perl_classes_(false),
      word_boundary_(false),
      one_line_(false) {
    }